

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_cookie.cpp
# Opt level: O2

void __thiscall cppcms::http::cookie::~cookie(cookie *this)

{
  std::__cxx11::string::~string((string *)&this->comment_);
  std::__cxx11::string::~string((string *)&this->domain_);
  std::__cxx11::string::~string((string *)&this->path_);
  std::__cxx11::string::~string((string *)&this->value_);
  std::__cxx11::string::~string((string *)&this->name_);
  booster::copy_ptr<cppcms::http::cookie::_data>::~copy_ptr(&this->d);
  return;
}

Assistant:

cookie::~cookie() {}